

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-connection-fail.c
# Opt level: O1

void connection_fail(uv_connect_cb connect_cb)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 extraout_RAX;
  int iVar3;
  undefined1 *puVar4;
  char *pcVar5;
  uv_connect_t *puVar6;
  uv_tcp_t *puVar7;
  undefined8 in_R8;
  undefined8 in_R9;
  sockaddr_in server_addr;
  sockaddr_in client_addr;
  undefined1 auStack_28 [16];
  undefined1 local_18 [16];
  
  pcVar5 = "0.0.0.0";
  iVar3 = 0;
  iVar1 = uv_ip4_addr("0.0.0.0",0,local_18);
  if (iVar1 == 0) {
    puVar6 = (uv_connect_t *)0x194b6a;
    iVar3 = 0x23a3;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_28);
    if (iVar1 != 0) goto LAB_0014d8fd;
    puVar6 = (uv_connect_t *)uv_default_loop();
    iVar3 = 0x2dfbc0;
    iVar1 = uv_tcp_init();
    if (iVar1 != 0) goto LAB_0014d902;
    puVar7 = &tcp;
    puVar4 = local_18;
    iVar1 = uv_tcp_bind(&tcp,puVar4,0);
    iVar3 = (int)puVar4;
    puVar6 = (uv_connect_t *)puVar7;
    if (iVar1 != 0) goto LAB_0014d907;
    puVar6 = &req;
    iVar3 = 0x2dfbc0;
    iVar1 = uv_tcp_connect(&req,&tcp,auStack_28,connect_cb);
    if (iVar1 != 0) goto LAB_0014d90c;
    puVar6 = (uv_connect_t *)uv_default_loop();
    iVar3 = 0;
    uv_run();
    if (connect_cb_calls != 1) goto LAB_0014d911;
    if (close_cb_calls == 1) {
      return;
    }
  }
  else {
    connection_fail_cold_1();
    puVar6 = (uv_connect_t *)pcVar5;
LAB_0014d8fd:
    connection_fail_cold_2();
LAB_0014d902:
    connection_fail_cold_3();
LAB_0014d907:
    connection_fail_cold_4();
LAB_0014d90c:
    connection_fail_cold_5();
LAB_0014d911:
    connection_fail_cold_6();
  }
  connection_fail_cold_7();
  if ((uv_tcp_t *)(((uv_tcp_t *)puVar6)->u).reserved[3] == &tcp) {
    if (iVar3 != -0x6f) goto LAB_0014d952;
    connect_cb_calls = connect_cb_calls + 1;
    if (close_cb_calls == 0) {
      uv_close(&tcp,on_close);
      return;
    }
  }
  else {
    on_connect_with_close_cold_1();
LAB_0014d952:
    on_connect_with_close_cold_2();
  }
  on_connect_with_close_cold_3();
  uVar2 = uv_default_loop();
  iVar3 = 0x2dfb28;
  iVar1 = uv_timer_init(uVar2);
  if (iVar1 == 0) {
    connection_fail(on_connect_without_close);
    if (timer_close_cb_calls != 1) goto LAB_0014d9d0;
    if (timer_cb_calls == 1) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      iVar3 = 0;
      uv_run(uVar2);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_0014d9da;
    }
  }
  else {
    run_test_connection_fail_doesnt_auto_close_cold_1();
LAB_0014d9d0:
    run_test_connection_fail_doesnt_auto_close_cold_2();
  }
  run_test_connection_fail_doesnt_auto_close_cold_3();
LAB_0014d9da:
  run_test_connection_fail_doesnt_auto_close_cold_4();
  if (iVar3 == -0x6f) {
    connect_cb_calls = connect_cb_calls + 1;
    uv_timer_start(&timer,timer_cb,100,0,in_R8,in_R9,extraout_RAX);
    if (close_cb_calls == 0) {
      return;
    }
  }
  else {
    on_connect_without_close_cold_1();
  }
  on_connect_without_close_cold_2();
  close_cb_calls = close_cb_calls + 1;
  return;
}

Assistant:

static void connection_fail(uv_connect_cb connect_cb) {
  struct sockaddr_in client_addr, server_addr;
  int r;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", 0, &client_addr));

  /* There should be no servers listening on this port. */
  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &server_addr));

  /* Try to connect to the server and do NUM_PINGS ping-pongs. */
  r = uv_tcp_init(uv_default_loop(), &tcp);
  ASSERT(!r);

  /* We are never doing multiple reads/connects at a time anyway. so these
   * handles can be pre-initialized. */
  ASSERT(0 == uv_tcp_bind(&tcp, (const struct sockaddr*) &client_addr, 0));

  r = uv_tcp_connect(&req,
                     &tcp,
                     (const struct sockaddr*) &server_addr,
                     connect_cb);
  ASSERT(!r);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(connect_cb_calls == 1);
  ASSERT(close_cb_calls == 1);
}